

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O1

void test_write_one_buffer_one_chunk_error_sync(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  cio_write_buffer wb;
  cio_write_buffer wbh;
  undefined1 local_58 [24];
  undefined8 local_40;
  cio_write_buffer local_38;
  
  ms = (memory_stream *)malloc(0x100);
  local_58._16_8_ = "Hello";
  local_40 = 5;
  local_38.data.head.q_len = 1;
  local_38.data.element.length = 5;
  local_58._0_8_ = &local_38;
  local_58._8_8_ = &local_38;
  local_38.next = (cio_write_buffer *)local_58;
  local_38.prev = (cio_write_buffer *)local_58;
  iVar1 = memory_stream_init(ms,"");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x605,UNITY_DISPLAY_STYLE_INT);
  write_some_fake.custom_fake = write_some_error_sync;
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x609,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_write(buffered_stream,&local_38,dummy_write_handler,(void *)0x0);
  if (cVar2 != CIO_SUCCESS) {
    cVar2 = cio_buffered_stream_close(buffered_stream);
    UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x60e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x60f,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)dummy_write_handler_fake.call_count,"Handler was not called!",0x610,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Return value not correct!",0x60b);
}

Assistant:

static void test_write_one_buffer_one_chunk_error_sync(void)
{
	static const char *test_data = "Hello";

	struct client *client = malloc(sizeof(*client));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	struct cio_write_buffer wb;
	cio_write_buffer_const_element_init(&wb, test_data, strlen(test_data));
	cio_write_buffer_queue_tail(&wbh, &wb);

	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, ""), "Could not allocate memory for test!");
	write_some_fake.custom_fake = write_some_error_sync;

	enum cio_error err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_write(&client->bs, &wbh, dummy_write_handler, NULL);
	TEST_ASSERT_NOT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(0, dummy_write_handler_fake.call_count, "Handler was not called!");
}